

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O2

xpath_node_set_raw * __thiscall
pugi::impl::anon_unknown_0::xpath_ast_node::eval_node_set
          (xpath_node_set_raw *__return_storage_ptr__,xpath_ast_node *this,xpath_context *c,
          xpath_stack *stack,nodeset_eval_t eval)

{
  char cVar1;
  xml_node_struct *pxVar2;
  xml_attribute_struct *pxVar3;
  xpath_ast_node *pxVar4;
  xpath_node *pxVar5;
  xpath_node *pxVar6;
  type_t type;
  xpath_variable *pxVar7;
  long lVar8;
  xpath_memory_block *pxVar9;
  bool bVar10;
  xpath_allocator_capture cr;
  xpath_stack swapped_stack;
  xpath_node_set_raw rs;
  xpath_node_set_raw local_80;
  xpath_stack local_60;
  xpath_node_set_raw local_50;
  
  cVar1 = this->_type;
  switch(cVar1) {
  case '\x0f':
    local_80._0_8_ = stack->temp;
    local_80._begin = (xpath_node *)((xml_node_struct *)local_80._0_8_)->header;
    local_80._end = (xpath_node *)((xml_node_struct *)local_80._0_8_)->name;
    local_80._eos = (xpath_node *)((xml_node_struct *)local_80._0_8_)->value;
    local_60.temp = stack->result;
    local_60.result = (xpath_allocator *)local_80._0_8_;
    eval_node_set(__return_storage_ptr__,this->_left,c,stack,eval);
    eval_node_set(&local_50,this->_right,c,&local_60,eval);
    __return_storage_ptr__->_type = type_unsorted;
    xpath_node_set_raw::append(__return_storage_ptr__,local_50._begin,local_50._end,stack->result);
    xpath_node_set_raw::remove_duplicates(__return_storage_ptr__,stack->temp);
    xpath_allocator_capture::~xpath_allocator_capture((xpath_allocator_capture *)&local_80);
    return __return_storage_ptr__;
  case '\x11':
    eval_node_set(__return_storage_ptr__,this->_left,c,stack,(uint)(this->_test == '\x03') * 2);
    type = __return_storage_ptr__->_type;
    if (this->_test != '\x01') {
      type = xpath_sort(__return_storage_ptr__->_begin,__return_storage_ptr__->_end,type,false);
      __return_storage_ptr__->_type = type;
    }
    bVar10 = eval == nodeset_eval_any;
    if (type == type_sorted) {
      bVar10 = eval != nodeset_eval_all;
    }
    apply_predicate(this,__return_storage_ptr__,0,stack,bVar10);
    return __return_storage_ptr__;
  case '\x14':
    if (this->_rettype == '\x01') {
      pxVar7 = (xpath_variable *)&(anonymous_namespace)::dummy_node_set;
      if (((this->_data).variable)->_type == xpath_type_node_set) {
        pxVar7 = (this->_data).variable + 1;
      }
      __return_storage_ptr__->_begin = (xpath_node *)0x0;
      __return_storage_ptr__->_end = (xpath_node *)0x0;
      __return_storage_ptr__->_eos = (xpath_node *)0x0;
      __return_storage_ptr__->_type = pxVar7->_type;
      xpath_node_set_raw::append
                (__return_storage_ptr__,(xpath_node *)pxVar7[1]._next,*(xpath_node **)(pxVar7 + 2),
                 stack->result);
      return __return_storage_ptr__;
    }
  case '\x10':
  case '\x12':
  case '\x13':
  case '\x15':
  case '\x16':
  case '\x17':
  case '\x18':
switchD_00118890_caseD_10:
    __return_storage_ptr__->_type = type_unsorted;
    __return_storage_ptr__->_begin = (xpath_node *)0x0;
    __return_storage_ptr__->_end = (xpath_node *)0x0;
    __return_storage_ptr__->_eos = (xpath_node *)0x0;
    return __return_storage_ptr__;
  }
  if (cVar1 != '8') {
    if (cVar1 != '9') goto switchD_00118890_caseD_10;
    __return_storage_ptr__->_begin = (xpath_node *)0x0;
    __return_storage_ptr__->_end = (xpath_node *)0x0;
    __return_storage_ptr__->_eos = (xpath_node *)0x0;
    __return_storage_ptr__->_type = type_sorted;
    pxVar2 = (c->n)._node._root;
    pxVar3 = (c->n)._attribute._attr;
    if (pxVar2 == (xml_node_struct *)0x0 || pxVar3 != (xml_attribute_struct *)0x0) {
      if (pxVar3 == (xml_attribute_struct *)0x0) {
        return __return_storage_ptr__;
      }
      if (pxVar2 == (xml_node_struct *)0x0) {
        local_80._0_8_ = (xml_node_struct *)0x0;
        goto LAB_0011897d;
      }
    }
    local_80._0_8_ = *(long *)((long)pxVar2 - (pxVar2->header >> 8)) + -0x40;
LAB_0011897d:
    local_80._begin = (xpath_node *)0x0;
    xpath_node_set_raw::push_back(__return_storage_ptr__,(xpath_node *)&local_80,stack->result);
    return __return_storage_ptr__;
  }
  switch(this->_axis) {
  case '\0':
    pxVar4 = this->_right;
    if (pxVar4 == (xpath_ast_node *)0x0) {
      bVar10 = eval == nodeset_eval_any;
    }
    else if (pxVar4->_next == (xpath_ast_node *)0x0) {
      bVar10 = pxVar4->_test == '\x03';
    }
    else {
      bVar10 = false;
    }
    __return_storage_ptr__->_eos = (xpath_node *)0x0;
    __return_storage_ptr__->_begin = (xpath_node *)0x0;
    __return_storage_ptr__->_end = (xpath_node *)0x0;
    __return_storage_ptr__->_type = type_sorted_reverse;
    if (this->_left != (xpath_ast_node *)0x0) {
      eval_node_set(&local_80,this->_left,c,stack,nodeset_eval_all);
      for (pxVar9 = (xpath_memory_block *)local_80._begin;
          pxVar9 != (xpath_memory_block *)local_80._end;
          pxVar9 = (xpath_memory_block *)&pxVar9->field_2) {
        lVar8 = (long)__return_storage_ptr__->_end - (long)__return_storage_ptr__->_begin;
        if (lVar8 != 0) {
          __return_storage_ptr__->_type = type_unsorted;
        }
        step_fill<pugi::impl::(anonymous_namespace)::axis_to_type<(pugi::impl::(anonymous_namespace)::axis_t)0>_>
                  (this,__return_storage_ptr__,pxVar9,stack->result,bVar10);
        if (this->_right != (xpath_ast_node *)0x0) {
          apply_predicates(this,__return_storage_ptr__,lVar8 >> 4,stack,eval);
        }
      }
      goto LAB_001193f6;
    }
    step_fill<pugi::impl::(anonymous_namespace)::axis_to_type<(pugi::impl::(anonymous_namespace)::axis_t)0>_>
              (this,__return_storage_ptr__,c,stack->result,bVar10);
    break;
  case '\x01':
    pxVar4 = this->_right;
    if (pxVar4 == (xpath_ast_node *)0x0) {
      bVar10 = eval == nodeset_eval_any;
    }
    else if (pxVar4->_next == (xpath_ast_node *)0x0) {
      bVar10 = pxVar4->_test == '\x03';
    }
    else {
      bVar10 = false;
    }
    __return_storage_ptr__->_eos = (xpath_node *)0x0;
    __return_storage_ptr__->_begin = (xpath_node *)0x0;
    __return_storage_ptr__->_end = (xpath_node *)0x0;
    __return_storage_ptr__->_type = type_sorted_reverse;
    if (this->_left != (xpath_ast_node *)0x0) {
      eval_node_set(&local_80,this->_left,c,stack,nodeset_eval_all);
      for (pxVar9 = (xpath_memory_block *)local_80._begin;
          pxVar9 != (xpath_memory_block *)local_80._end;
          pxVar9 = (xpath_memory_block *)&pxVar9->field_2) {
        lVar8 = (long)__return_storage_ptr__->_end - (long)__return_storage_ptr__->_begin;
        if (lVar8 != 0) {
          __return_storage_ptr__->_type = type_unsorted;
        }
        step_fill<pugi::impl::(anonymous_namespace)::axis_to_type<(pugi::impl::(anonymous_namespace)::axis_t)1>_>
                  (this,__return_storage_ptr__,pxVar9,stack->result,bVar10);
        if (this->_right != (xpath_ast_node *)0x0) {
          apply_predicates(this,__return_storage_ptr__,lVar8 >> 4,stack,eval);
        }
      }
      goto LAB_001193f6;
    }
    step_fill<pugi::impl::(anonymous_namespace)::axis_to_type<(pugi::impl::(anonymous_namespace)::axis_t)1>_>
              (this,__return_storage_ptr__,c,stack->result,bVar10);
    break;
  case '\x02':
    bVar10 = true;
    if (this->_test != '\x01') {
      pxVar4 = this->_right;
      if (pxVar4 == (xpath_ast_node *)0x0) {
        bVar10 = eval != nodeset_eval_all;
      }
      else if (pxVar4->_next == (xpath_ast_node *)0x0) {
        bVar10 = pxVar4->_test == '\x03';
      }
      else {
        bVar10 = false;
      }
    }
    __return_storage_ptr__->_eos = (xpath_node *)0x0;
    __return_storage_ptr__->_begin = (xpath_node *)0x0;
    __return_storage_ptr__->_end = (xpath_node *)0x0;
    __return_storage_ptr__->_type = type_sorted;
    if (this->_left != (xpath_ast_node *)0x0) {
      eval_node_set(&local_80,this->_left,c,stack,nodeset_eval_all);
      for (pxVar9 = (xpath_memory_block *)local_80._begin;
          pxVar9 != (xpath_memory_block *)local_80._end;
          pxVar9 = (xpath_memory_block *)&pxVar9->field_2) {
        lVar8 = (long)__return_storage_ptr__->_end - (long)__return_storage_ptr__->_begin;
        if (lVar8 != 0) {
          __return_storage_ptr__->_type = type_unsorted;
        }
        step_fill<pugi::impl::(anonymous_namespace)::axis_to_type<(pugi::impl::(anonymous_namespace)::axis_t)2>_>
                  (this,__return_storage_ptr__,pxVar9,stack->result,bVar10);
        if (this->_right != (xpath_ast_node *)0x0) {
          apply_predicates(this,__return_storage_ptr__,lVar8 >> 4,stack,eval);
        }
      }
      return __return_storage_ptr__;
    }
    step_fill<pugi::impl::(anonymous_namespace)::axis_to_type<(pugi::impl::(anonymous_namespace)::axis_t)2>_>
              (this,__return_storage_ptr__,c,stack->result,bVar10);
    goto LAB_001194ca;
  case '\x03':
    pxVar4 = this->_right;
    if (pxVar4 == (xpath_ast_node *)0x0) {
      bVar10 = eval != nodeset_eval_all;
    }
    else if (pxVar4->_next == (xpath_ast_node *)0x0) {
      bVar10 = pxVar4->_test == '\x03';
    }
    else {
      bVar10 = false;
    }
    __return_storage_ptr__->_eos = (xpath_node *)0x0;
    __return_storage_ptr__->_begin = (xpath_node *)0x0;
    __return_storage_ptr__->_end = (xpath_node *)0x0;
    __return_storage_ptr__->_type = type_sorted;
    if (this->_left != (xpath_ast_node *)0x0) {
      eval_node_set(&local_80,this->_left,c,stack,nodeset_eval_all);
      for (pxVar9 = (xpath_memory_block *)local_80._begin;
          pxVar9 != (xpath_memory_block *)local_80._end;
          pxVar9 = (xpath_memory_block *)&pxVar9->field_2) {
        lVar8 = (long)__return_storage_ptr__->_end - (long)__return_storage_ptr__->_begin;
        if (lVar8 != 0) {
          __return_storage_ptr__->_type = type_unsorted;
        }
        step_fill<pugi::impl::(anonymous_namespace)::axis_to_type<(pugi::impl::(anonymous_namespace)::axis_t)3>_>
                  (this,__return_storage_ptr__,pxVar9,stack->result,bVar10);
        if (this->_right != (xpath_ast_node *)0x0) {
          apply_predicates(this,__return_storage_ptr__,lVar8 >> 4,stack,eval);
        }
      }
      return __return_storage_ptr__;
    }
    step_fill<pugi::impl::(anonymous_namespace)::axis_to_type<(pugi::impl::(anonymous_namespace)::axis_t)3>_>
              (this,__return_storage_ptr__,c,stack->result,bVar10);
    goto LAB_001194ca;
  case '\x04':
    pxVar4 = this->_right;
    if (pxVar4 == (xpath_ast_node *)0x0) {
      bVar10 = eval != nodeset_eval_all;
    }
    else if (pxVar4->_next == (xpath_ast_node *)0x0) {
      bVar10 = pxVar4->_test == '\x03';
    }
    else {
      bVar10 = false;
    }
    __return_storage_ptr__->_eos = (xpath_node *)0x0;
    __return_storage_ptr__->_begin = (xpath_node *)0x0;
    __return_storage_ptr__->_end = (xpath_node *)0x0;
    __return_storage_ptr__->_type = type_sorted;
    if (this->_left != (xpath_ast_node *)0x0) {
      eval_node_set(&local_80,this->_left,c,stack,nodeset_eval_all);
      for (pxVar9 = (xpath_memory_block *)local_80._begin;
          pxVar9 != (xpath_memory_block *)local_80._end;
          pxVar9 = (xpath_memory_block *)&pxVar9->field_2) {
        lVar8 = (long)__return_storage_ptr__->_end - (long)__return_storage_ptr__->_begin;
        if (lVar8 != 0) {
          __return_storage_ptr__->_type = type_unsorted;
        }
        step_fill<pugi::impl::(anonymous_namespace)::axis_to_type<(pugi::impl::(anonymous_namespace)::axis_t)4>_>
                  (this,__return_storage_ptr__,pxVar9,stack->result,bVar10);
        if (this->_right != (xpath_ast_node *)0x0) {
          apply_predicates(this,__return_storage_ptr__,lVar8 >> 4,stack,eval);
        }
      }
      goto LAB_001193f6;
    }
    step_fill<pugi::impl::(anonymous_namespace)::axis_to_type<(pugi::impl::(anonymous_namespace)::axis_t)4>_>
              (this,__return_storage_ptr__,c,stack->result,bVar10);
    break;
  case '\x05':
    pxVar4 = this->_right;
    if (pxVar4 == (xpath_ast_node *)0x0) {
      bVar10 = eval != nodeset_eval_all;
    }
    else if (pxVar4->_next == (xpath_ast_node *)0x0) {
      bVar10 = pxVar4->_test == '\x03';
    }
    else {
      bVar10 = false;
    }
    __return_storage_ptr__->_eos = (xpath_node *)0x0;
    __return_storage_ptr__->_begin = (xpath_node *)0x0;
    __return_storage_ptr__->_end = (xpath_node *)0x0;
    __return_storage_ptr__->_type = type_sorted;
    if (this->_left != (xpath_ast_node *)0x0) {
      eval_node_set(&local_80,this->_left,c,stack,nodeset_eval_all);
      for (pxVar9 = (xpath_memory_block *)local_80._begin;
          pxVar9 != (xpath_memory_block *)local_80._end;
          pxVar9 = (xpath_memory_block *)&pxVar9->field_2) {
        lVar8 = (long)__return_storage_ptr__->_end - (long)__return_storage_ptr__->_begin;
        if (lVar8 != 0) {
          __return_storage_ptr__->_type = type_unsorted;
        }
        step_fill<pugi::impl::(anonymous_namespace)::axis_to_type<(pugi::impl::(anonymous_namespace)::axis_t)5>_>
                  (this,__return_storage_ptr__,pxVar9,stack->result,bVar10);
        if (this->_right != (xpath_ast_node *)0x0) {
          apply_predicates(this,__return_storage_ptr__,lVar8 >> 4,stack,eval);
        }
      }
      goto LAB_001193f6;
    }
    step_fill<pugi::impl::(anonymous_namespace)::axis_to_type<(pugi::impl::(anonymous_namespace)::axis_t)5>_>
              (this,__return_storage_ptr__,c,stack->result,bVar10);
    break;
  case '\x06':
    pxVar4 = this->_right;
    if (pxVar4 == (xpath_ast_node *)0x0) {
      bVar10 = eval != nodeset_eval_all;
    }
    else if (pxVar4->_next == (xpath_ast_node *)0x0) {
      bVar10 = pxVar4->_test == '\x03';
    }
    else {
      bVar10 = false;
    }
    __return_storage_ptr__->_eos = (xpath_node *)0x0;
    __return_storage_ptr__->_begin = (xpath_node *)0x0;
    __return_storage_ptr__->_end = (xpath_node *)0x0;
    __return_storage_ptr__->_type = type_sorted;
    if (this->_left != (xpath_ast_node *)0x0) {
      eval_node_set(&local_80,this->_left,c,stack,nodeset_eval_all);
      for (pxVar9 = (xpath_memory_block *)local_80._begin;
          pxVar9 != (xpath_memory_block *)local_80._end;
          pxVar9 = (xpath_memory_block *)&pxVar9->field_2) {
        lVar8 = (long)__return_storage_ptr__->_end - (long)__return_storage_ptr__->_begin;
        if (lVar8 != 0) {
          __return_storage_ptr__->_type = type_unsorted;
        }
        step_fill<pugi::impl::(anonymous_namespace)::axis_to_type<(pugi::impl::(anonymous_namespace)::axis_t)6>_>
                  (this,__return_storage_ptr__,pxVar9,stack->result,bVar10);
        if (this->_right != (xpath_ast_node *)0x0) {
          apply_predicates(this,__return_storage_ptr__,lVar8 >> 4,stack,eval);
        }
      }
      goto LAB_001193f6;
    }
    step_fill<pugi::impl::(anonymous_namespace)::axis_to_type<(pugi::impl::(anonymous_namespace)::axis_t)6>_>
              (this,__return_storage_ptr__,c,stack->result,bVar10);
    break;
  case '\a':
    pxVar4 = this->_right;
    if (pxVar4 == (xpath_ast_node *)0x0) {
      bVar10 = eval != nodeset_eval_all;
    }
    else if (pxVar4->_next == (xpath_ast_node *)0x0) {
      bVar10 = pxVar4->_test == '\x03';
    }
    else {
      bVar10 = false;
    }
    __return_storage_ptr__->_eos = (xpath_node *)0x0;
    __return_storage_ptr__->_begin = (xpath_node *)0x0;
    __return_storage_ptr__->_end = (xpath_node *)0x0;
    __return_storage_ptr__->_type = type_sorted;
    if (this->_left != (xpath_ast_node *)0x0) {
      eval_node_set(&local_80,this->_left,c,stack,nodeset_eval_all);
      for (pxVar9 = (xpath_memory_block *)local_80._begin;
          pxVar9 != (xpath_memory_block *)local_80._end;
          pxVar9 = (xpath_memory_block *)&pxVar9->field_2) {
        lVar8 = (long)__return_storage_ptr__->_end - (long)__return_storage_ptr__->_begin;
        if (lVar8 != 0) {
          __return_storage_ptr__->_type = type_unsorted;
        }
        step_fill<pugi::impl::(anonymous_namespace)::axis_to_type<(pugi::impl::(anonymous_namespace)::axis_t)7>_>
                  (this,__return_storage_ptr__,pxVar9,stack->result,bVar10);
        if (this->_right != (xpath_ast_node *)0x0) {
          apply_predicates(this,__return_storage_ptr__,lVar8 >> 4,stack,eval);
        }
      }
      goto LAB_001193f6;
    }
    step_fill<pugi::impl::(anonymous_namespace)::axis_to_type<(pugi::impl::(anonymous_namespace)::axis_t)7>_>
              (this,__return_storage_ptr__,c,stack->result,bVar10);
    break;
  default:
    goto switchD_00118890_caseD_10;
  case '\t':
    __return_storage_ptr__->_eos = (xpath_node *)0x0;
    __return_storage_ptr__->_begin = (xpath_node *)0x0;
    __return_storage_ptr__->_end = (xpath_node *)0x0;
    __return_storage_ptr__->_type = type_sorted;
    if (this->_left != (xpath_ast_node *)0x0) {
      eval_node_set(&local_80,this->_left,c,stack,nodeset_eval_all);
      for (pxVar9 = (xpath_memory_block *)local_80._begin;
          pxVar9 != (xpath_memory_block *)local_80._end;
          pxVar9 = (xpath_memory_block *)&pxVar9->field_2) {
        lVar8 = (long)__return_storage_ptr__->_end - (long)__return_storage_ptr__->_begin;
        if (lVar8 != 0) {
          __return_storage_ptr__->_type = type_unsorted;
        }
        step_fill<pugi::impl::(anonymous_namespace)::axis_to_type<(pugi::impl::(anonymous_namespace)::axis_t)9>_>
                  (this,__return_storage_ptr__,pxVar9,stack->result);
        if (this->_right != (xpath_ast_node *)0x0) {
          apply_predicates(this,__return_storage_ptr__,lVar8 >> 4,stack,eval);
        }
      }
      goto LAB_001193f6;
    }
    step_fill<pugi::impl::(anonymous_namespace)::axis_to_type<(pugi::impl::(anonymous_namespace)::axis_t)9>_>
              (this,__return_storage_ptr__,c,stack->result);
    break;
  case '\n':
    pxVar4 = this->_right;
    if (pxVar4 == (xpath_ast_node *)0x0) {
      bVar10 = eval == nodeset_eval_any;
    }
    else if (pxVar4->_next == (xpath_ast_node *)0x0) {
      bVar10 = pxVar4->_test == '\x03';
    }
    else {
      bVar10 = false;
    }
    __return_storage_ptr__->_eos = (xpath_node *)0x0;
    __return_storage_ptr__->_begin = (xpath_node *)0x0;
    __return_storage_ptr__->_end = (xpath_node *)0x0;
    __return_storage_ptr__->_type = type_sorted_reverse;
    if (this->_left != (xpath_ast_node *)0x0) {
      eval_node_set(&local_80,this->_left,c,stack,nodeset_eval_all);
      for (pxVar9 = (xpath_memory_block *)local_80._begin;
          pxVar9 != (xpath_memory_block *)local_80._end;
          pxVar9 = (xpath_memory_block *)&pxVar9->field_2) {
        lVar8 = (long)__return_storage_ptr__->_end - (long)__return_storage_ptr__->_begin;
        if (lVar8 != 0) {
          __return_storage_ptr__->_type = type_unsorted;
        }
        step_fill<pugi::impl::(anonymous_namespace)::axis_to_type<(pugi::impl::(anonymous_namespace)::axis_t)10>_>
                  (this,__return_storage_ptr__,pxVar9,stack->result,bVar10);
        if (this->_right != (xpath_ast_node *)0x0) {
          apply_predicates(this,__return_storage_ptr__,lVar8 >> 4,stack,eval);
        }
      }
      goto LAB_001193f6;
    }
    step_fill<pugi::impl::(anonymous_namespace)::axis_to_type<(pugi::impl::(anonymous_namespace)::axis_t)10>_>
              (this,__return_storage_ptr__,c,stack->result,bVar10);
    break;
  case '\v':
    pxVar4 = this->_right;
    if (pxVar4 == (xpath_ast_node *)0x0) {
      bVar10 = eval == nodeset_eval_any;
    }
    else if (pxVar4->_next == (xpath_ast_node *)0x0) {
      bVar10 = pxVar4->_test == '\x03';
    }
    else {
      bVar10 = false;
    }
    __return_storage_ptr__->_eos = (xpath_node *)0x0;
    __return_storage_ptr__->_begin = (xpath_node *)0x0;
    __return_storage_ptr__->_end = (xpath_node *)0x0;
    __return_storage_ptr__->_type = type_sorted_reverse;
    if (this->_left != (xpath_ast_node *)0x0) {
      eval_node_set(&local_80,this->_left,c,stack,nodeset_eval_all);
      for (pxVar9 = (xpath_memory_block *)local_80._begin;
          pxVar9 != (xpath_memory_block *)local_80._end;
          pxVar9 = (xpath_memory_block *)&pxVar9->field_2) {
        lVar8 = (long)__return_storage_ptr__->_end - (long)__return_storage_ptr__->_begin;
        if (lVar8 != 0) {
          __return_storage_ptr__->_type = type_unsorted;
        }
        step_fill<pugi::impl::(anonymous_namespace)::axis_to_type<(pugi::impl::(anonymous_namespace)::axis_t)11>_>
                  (this,__return_storage_ptr__,pxVar9,stack->result,bVar10);
        if (this->_right != (xpath_ast_node *)0x0) {
          apply_predicates(this,__return_storage_ptr__,lVar8 >> 4,stack,eval);
        }
      }
      goto LAB_001193f6;
    }
    step_fill<pugi::impl::(anonymous_namespace)::axis_to_type<(pugi::impl::(anonymous_namespace)::axis_t)11>_>
              (this,__return_storage_ptr__,c,stack->result,bVar10);
    break;
  case '\f':
    __return_storage_ptr__->_eos = (xpath_node *)0x0;
    __return_storage_ptr__->_begin = (xpath_node *)0x0;
    __return_storage_ptr__->_end = (xpath_node *)0x0;
    __return_storage_ptr__->_type = type_sorted;
    if (this->_left != (xpath_ast_node *)0x0) {
      eval_node_set(&local_80,this->_left,c,stack,nodeset_eval_all);
      __return_storage_ptr__->_type = local_80._type;
      for (pxVar9 = (xpath_memory_block *)local_80._begin;
          pxVar9 != (xpath_memory_block *)local_80._end;
          pxVar9 = (xpath_memory_block *)&pxVar9->field_2) {
        pxVar5 = __return_storage_ptr__->_begin;
        pxVar6 = __return_storage_ptr__->_end;
        step_fill<pugi::impl::(anonymous_namespace)::axis_to_type<(pugi::impl::(anonymous_namespace)::axis_t)12>_>
                  (this,__return_storage_ptr__,pxVar9,stack->result);
        if (this->_right != (xpath_ast_node *)0x0) {
          apply_predicates(this,__return_storage_ptr__,(long)pxVar6 - (long)pxVar5 >> 4,stack,eval);
        }
      }
      return __return_storage_ptr__;
    }
    step_fill<pugi::impl::(anonymous_namespace)::axis_to_type<(pugi::impl::(anonymous_namespace)::axis_t)12>_>
              (this,__return_storage_ptr__,c,stack->result);
LAB_001194ca:
    if (this->_right == (xpath_ast_node *)0x0) {
      return __return_storage_ptr__;
    }
    apply_predicates(this,__return_storage_ptr__,0,stack,eval);
    return __return_storage_ptr__;
  }
  if (this->_right != (xpath_ast_node *)0x0) {
    apply_predicates(this,__return_storage_ptr__,0,stack,eval);
  }
LAB_001193f6:
  if (__return_storage_ptr__->_type == type_unsorted) {
    xpath_node_set_raw::remove_duplicates(__return_storage_ptr__,stack->temp);
  }
  return __return_storage_ptr__;
}

Assistant:

xpath_node_set_raw eval_node_set(const xpath_context& c, const xpath_stack& stack, nodeset_eval_t eval)
		{
			switch (_type)
			{
			case ast_op_union:
			{
				xpath_allocator_capture cr(stack.temp);

				xpath_stack swapped_stack = {stack.temp, stack.result};

				xpath_node_set_raw ls = _left->eval_node_set(c, stack, eval);
				xpath_node_set_raw rs = _right->eval_node_set(c, swapped_stack, eval);

				// we can optimize merging two sorted sets, but this is a very rare operation, so don't bother
				ls.set_type(xpath_node_set::type_unsorted);

				ls.append(rs.begin(), rs.end(), stack.result);
				ls.remove_duplicates(stack.temp);

				return ls;
			}

			case ast_filter:
			{
				xpath_node_set_raw set = _left->eval_node_set(c, stack, _test == predicate_constant_one ? nodeset_eval_first : nodeset_eval_all);

				// either expression is a number or it contains position() call; sort by document order
				if (_test != predicate_posinv) set.sort_do();

				bool once = eval_once(set.type(), eval);

				apply_predicate(set, 0, stack, once);

				return set;
			}

			case ast_func_id:
				return xpath_node_set_raw();

			case ast_step:
			{
				switch (_axis)
				{
				case axis_ancestor:
					return step_do(c, stack, eval, axis_to_type<axis_ancestor>());

				case axis_ancestor_or_self:
					return step_do(c, stack, eval, axis_to_type<axis_ancestor_or_self>());

				case axis_attribute:
					return step_do(c, stack, eval, axis_to_type<axis_attribute>());

				case axis_child:
					return step_do(c, stack, eval, axis_to_type<axis_child>());

				case axis_descendant:
					return step_do(c, stack, eval, axis_to_type<axis_descendant>());

				case axis_descendant_or_self:
					return step_do(c, stack, eval, axis_to_type<axis_descendant_or_self>());

				case axis_following:
					return step_do(c, stack, eval, axis_to_type<axis_following>());

				case axis_following_sibling:
					return step_do(c, stack, eval, axis_to_type<axis_following_sibling>());

				case axis_namespace:
					// namespaced axis is not supported
					return xpath_node_set_raw();

				case axis_parent:
					return step_do(c, stack, eval, axis_to_type<axis_parent>());

				case axis_preceding:
					return step_do(c, stack, eval, axis_to_type<axis_preceding>());

				case axis_preceding_sibling:
					return step_do(c, stack, eval, axis_to_type<axis_preceding_sibling>());

				case axis_self:
					return step_do(c, stack, eval, axis_to_type<axis_self>());

				default:
					assert(false && "Unknown axis"); // unreachable
					return xpath_node_set_raw();
				}
			}

			case ast_step_root:
			{
				assert(!_right); // root step can't have any predicates

				xpath_node_set_raw ns;

				ns.set_type(xpath_node_set::type_sorted);

				if (c.n.node()) ns.push_back(c.n.node().root(), stack.result);
				else if (c.n.attribute()) ns.push_back(c.n.parent().root(), stack.result);

				return ns;
			}

			case ast_variable:
			{
				assert(_rettype == _data.variable->type());

				if (_rettype == xpath_type_node_set)
				{
					const xpath_node_set& s = _data.variable->get_node_set();

					xpath_node_set_raw ns;

					ns.set_type(s.type());
					ns.append(s.begin(), s.end(), stack.result);

					return ns;
				}
			}

			// fallthrough
			default:
				assert(false && "Wrong expression for return type node set"); // unreachable
				return xpath_node_set_raw();
			}
		}